

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long_double>::AutoFill
          (TPZMatrix<long_double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  int iVar2;
  TPZMatrix<long_double> *pTVar3;
  TPZMatrix<long_double> *pTVar4;
  TPZMatrix<long_double> *pTVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble lVar10;
  longdouble in_ST3;
  longdouble lVar11;
  longdouble in_ST4;
  longdouble lVar12;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_58;
  undefined1 local_48 [24];
  
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  for (pTVar3 = (TPZMatrix<long_double> *)0x0; (long)pTVar3 < (this->super_TPZBaseMatrix).fRow;
      pTVar3 = (TPZMatrix<long_double> *)
               ((long)&(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
    lVar6 = in_ST1;
    lVar7 = in_ST2;
    lVar9 = in_ST3;
    lVar10 = in_ST4;
    lVar11 = in_ST5;
    if (symmetric == 0) {
      lVar8 = (longdouble)0;
      pTVar5 = (TPZMatrix<long_double> *)0x0;
    }
    else {
      lVar8 = (longdouble)0;
      for (pTVar4 = (TPZMatrix<long_double> *)0x0; pTVar5 = pTVar3, pTVar3 != pTVar4;
          pTVar4 = (TPZMatrix<long_double> *)
                   ((long)&(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
        lVar12 = in_ST6;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar4,pTVar3);
        local_58 = in_ST0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,pTVar3,pTVar4,&local_58);
        nrow = (int64_t)pTVar3;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar3,pTVar4);
        lVar8 = lVar8 + ABS(lVar6);
        in_ST0 = lVar7;
        lVar6 = lVar9;
        lVar7 = lVar10;
        lVar9 = lVar11;
        lVar10 = in_ST6;
        lVar11 = lVar12;
        in_ST6 = lVar12;
      }
    }
    for (; lVar1 = (this->super_TPZBaseMatrix).fCol, (long)pTVar5 < lVar1;
        pTVar5 = (TPZMatrix<long_double> *)
                 ((long)&(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
      GetRandomVal((longdouble *)this,(TPZMatrix<long_double> *)nrow);
      lVar12 = ABS(in_ST0) + lVar8;
      if (pTVar3 == pTVar5) {
        lVar12 = lVar8;
      }
      lVar8 = lVar12;
      nrow = (int64_t)pTVar3;
      lVar12 = in_ST6;
      iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,pTVar3,pTVar5,local_48);
      if (iVar2 == 0) {
        nrow = 0;
        Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
      }
      in_ST0 = lVar6;
      lVar6 = lVar7;
      lVar7 = lVar9;
      lVar9 = lVar10;
      lVar10 = lVar11;
      lVar11 = in_ST6;
      in_ST6 = lVar12;
    }
    in_ST1 = lVar6;
    in_ST2 = lVar7;
    in_ST3 = lVar9;
    in_ST4 = lVar10;
    in_ST5 = lVar11;
    if ((this->super_TPZBaseMatrix).fRow == lVar1) {
      nrow = (int64_t)pTVar3;
      lVar12 = lVar11;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar3,pTVar3);
      if (ABS(in_ST0) < ABS(lVar8)) {
        local_58 = lVar8 + (longdouble)1;
        nrow = (int64_t)pTVar3;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,pTVar3,pTVar3,&local_58);
      }
      in_ST0 = lVar6;
      in_ST1 = lVar7;
      in_ST2 = lVar9;
      in_ST3 = lVar10;
      in_ST4 = lVar11;
      in_ST5 = lVar12;
      in_ST6 = lVar12;
      if ((ABS(lVar8) < (longdouble)1e-16) &&
         (nrow = (int64_t)pTVar3,
         (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar3,pTVar3),
         in_ST0 = lVar7, in_ST1 = lVar9, in_ST2 = lVar10, in_ST3 = lVar11, in_ST4 = lVar12,
         in_ST6 = in_ST5, ABS(lVar6) < (longdouble)1e-16)) {
        local_58 = (longdouble)1;
        nrow = (int64_t)pTVar3;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,pTVar3,pTVar3,&local_58);
        in_ST0 = lVar7;
        in_ST1 = lVar9;
        in_ST2 = lVar10;
        in_ST3 = lVar11;
        in_ST4 = lVar12;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}